

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_topointer(lua_State *L,int idx)

{
  TValue *pTVar1;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  switch(pTVar1->tt) {
  case 2:
  case 7:
    L_local = (lua_State *)lua_touserdata(L,idx);
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 5:
    L_local = (lua_State *)(pTVar1->value).gc;
    break;
  case 6:
    L_local = (lua_State *)(pTVar1->value).gc;
    break;
  case 8:
    L_local = (lua_State *)(pTVar1->value).gc;
  }
  return L_local;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  StkId o = index2adr(L, idx);
  switch (ttype(o)) {
    case LUA_TTABLE: return hvalue(o);
    case LUA_TFUNCTION: return clvalue(o);
    case LUA_TTHREAD: return thvalue(o);
    case LUA_TUSERDATA:
    case LUA_TLIGHTUSERDATA:
      return lua_touserdata(L, idx);
    default: return NULL;
  }
}